

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_address.cpp
# Opt level: O0

void __thiscall
AddressFactory_CreateP2wshAddress_Test::TestBody(AddressFactory_CreateP2wshAddress_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  char *pcVar3;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  Address addr;
  AddressFactory factory;
  Script script;
  Address *in_stack_fffffffffffffd08;
  undefined7 in_stack_fffffffffffffd10;
  undefined1 in_stack_fffffffffffffd17;
  AssertHelper local_2d0;
  Message local_2c8 [8];
  string local_288 [32];
  AssertionResult local_268;
  AssertHelper local_258;
  Message local_250;
  string local_248 [32];
  AssertionResult local_228;
  Script local_218 [6];
  AddressFactory local_a0;
  allocator local_61;
  string local_60 [32];
  Script local_40;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_60,"76a914ef286e6af39de178d88b32e120f716b53753808c88ac",&local_61);
  cfd::core::Script::Script(&local_40,local_60);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  cfd::AddressFactory::AddressFactory(&local_a0);
  cfd::AddressFactory::CreateP2wshAddress(local_218);
  cfd::core::Address::GetAddress_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_228,"addr.GetAddress().c_str()",
             "\"bc1q705w67ldrw5t4l5me7evc4nnf7m6tgq6tc85fr6j6zsuwt68kefqumhlug\"",pcVar3,
             "bc1q705w67ldrw5t4l5me7evc4nnf7m6tgq6tc85fr6j6zsuwt68kefqumhlug");
  std::__cxx11::string::~string(local_248);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_228);
  if (!bVar1) {
    testing::Message::Message(&local_250);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x188cf7);
    testing::internal::AssertHelper::AssertHelper
              (&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x123,pcVar3);
    testing::internal::AssertHelper::operator=(&local_258,&local_250);
    testing::internal::AssertHelper::~AssertHelper(&local_258);
    testing::Message::~Message((Message *)0x188d54);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x188dac);
  cfd::core::Address::GetScript(in_stack_fffffffffffffd08);
  cfd::core::Script::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_268,"addr.GetScript().GetHex().c_str()",
             "\"76a914ef286e6af39de178d88b32e120f716b53753808c88ac\"",pcVar3,
             "76a914ef286e6af39de178d88b32e120f716b53753808c88ac");
  std::__cxx11::string::~string(local_288);
  cfd::core::Script::~Script
            ((Script *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10));
  uVar2 = testing::AssertionResult::operator_cast_to_bool(&local_268);
  if (!(bool)uVar2) {
    testing::Message::Message(local_2c8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x188ebf);
    testing::internal::AssertHelper::AssertHelper
              (&local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x124,pcVar3);
    testing::internal::AssertHelper::operator=(&local_2d0,local_2c8);
    testing::internal::AssertHelper::~AssertHelper(&local_2d0);
    testing::Message::~Message((Message *)0x188f0b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x188f5a);
  cfd::core::Address::~Address((Address *)CONCAT17(uVar2,in_stack_fffffffffffffd10));
  cfd::AddressFactory::~AddressFactory((AddressFactory *)0x188f74);
  cfd::core::Script::~Script((Script *)CONCAT17(uVar2,in_stack_fffffffffffffd10));
  return;
}

Assistant:

TEST(AddressFactory, CreateP2wshAddress)
{
  Script script = Script("76a914ef286e6af39de178d88b32e120f716b53753808c88ac");
  {
    AddressFactory factory;
    Address addr = factory.CreateP2wshAddress(script);
    EXPECT_STREQ(addr.GetAddress().c_str(), "bc1q705w67ldrw5t4l5me7evc4nnf7m6tgq6tc85fr6j6zsuwt68kefqumhlug");
    EXPECT_STREQ(addr.GetScript().GetHex().c_str(), "76a914ef286e6af39de178d88b32e120f716b53753808c88ac");
  }
}